

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O0

decimal * simdjson::internal::parse_decimal(decimal *__return_storage_ptr__,char **p)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int local_48;
  int local_2c;
  uint8_t digit;
  int32_t exp_number;
  bool neg_exp;
  char *pcStack_20;
  int32_t trailing_zeros;
  char *preverse;
  char *first_after_period;
  char **p_local;
  
  __return_storage_ptr__->num_digits = 0;
  __return_storage_ptr__->decimal_point = 0;
  __return_storage_ptr__->truncated = false;
  __return_storage_ptr__->negative = **p == '-';
  if ((**p == '-') || (**p == '+')) {
    *p = *p + 1;
  }
  while (**p == '0') {
    *p = *p + 1;
  }
  while (bVar2 = is_integer(**p), bVar2) {
    if (__return_storage_ptr__->num_digits < 0x300) {
      __return_storage_ptr__->digits[__return_storage_ptr__->num_digits] = **p + 0xd0;
    }
    __return_storage_ptr__->num_digits = __return_storage_ptr__->num_digits + 1;
    *p = *p + 1;
  }
  if (**p == '.') {
    *p = *p + 1;
    pcVar1 = *p;
    if (__return_storage_ptr__->num_digits == 0) {
      while (**p == '0') {
        *p = *p + 1;
      }
    }
    while (bVar2 = is_integer(**p), bVar2) {
      if (__return_storage_ptr__->num_digits < 0x300) {
        __return_storage_ptr__->digits[__return_storage_ptr__->num_digits] = **p + 0xd0;
      }
      __return_storage_ptr__->num_digits = __return_storage_ptr__->num_digits + 1;
      *p = *p + 1;
    }
    __return_storage_ptr__->decimal_point = (int)pcVar1 - (int)*p;
  }
  if (__return_storage_ptr__->num_digits != 0) {
    pcStack_20 = *p;
    exp_number = 0;
    while( true ) {
      pcStack_20 = pcStack_20 + -1;
      bVar2 = true;
      if (*pcStack_20 != '0') {
        bVar2 = *pcStack_20 == '.';
      }
      if (!bVar2) break;
      if (*pcStack_20 == '0') {
        exp_number = exp_number + 1;
      }
    }
    __return_storage_ptr__->decimal_point =
         __return_storage_ptr__->num_digits + __return_storage_ptr__->decimal_point;
    __return_storage_ptr__->num_digits = __return_storage_ptr__->num_digits - exp_number;
  }
  if (0x300 < __return_storage_ptr__->num_digits) {
    __return_storage_ptr__->num_digits = 0x300;
    __return_storage_ptr__->truncated = true;
  }
  if ((**p == 'e') || (**p == 'E')) {
    *p = *p + 1;
    bVar2 = false;
    if (**p == '-') {
      bVar2 = true;
      *p = *p + 1;
    }
    else if (**p == '+') {
      *p = *p + 1;
    }
    local_2c = 0;
    while (bVar3 = is_integer(**p), bVar3) {
      if (local_2c < 0x10000) {
        local_2c = local_2c * 10 + (uint)(byte)(**p - 0x30);
      }
      *p = *p + 1;
    }
    if (bVar2) {
      local_48 = -local_2c;
    }
    else {
      local_48 = local_2c;
    }
    __return_storage_ptr__->decimal_point = local_48 + __return_storage_ptr__->decimal_point;
  }
  return __return_storage_ptr__;
}

Assistant:

decimal parse_decimal(const char *&p) noexcept {
  decimal answer;
  answer.num_digits = 0;
  answer.decimal_point = 0;
  answer.truncated = false;
  answer.negative = (*p == '-');
  if ((*p == '-') || (*p == '+')) {
    ++p;
  }

  while (*p == '0') {
    ++p;
  }
  while (is_integer(*p)) {
    if (answer.num_digits < max_digits) {
      answer.digits[answer.num_digits] = uint8_t(*p - '0');
    }
    answer.num_digits++;
    ++p;
  }
  if (*p == '.') {
    ++p;
    const char *first_after_period = p;
    // if we have not yet encountered a zero, we have to skip it as well
    if (answer.num_digits == 0) {
      // skip zeros
      while (*p == '0') {
        ++p;
      }
    }
    while (is_integer(*p)) {
      if (answer.num_digits < max_digits) {
        answer.digits[answer.num_digits] = uint8_t(*p - '0');
      }
      answer.num_digits++;
      ++p;
    }
    answer.decimal_point = int32_t(first_after_period - p);
  }
  if(answer.num_digits > 0) {
    const char *preverse = p - 1;
    int32_t trailing_zeros = 0;
    while ((*preverse == '0') || (*preverse == '.')) {
      if(*preverse == '0') { trailing_zeros++; };
      --preverse;
    }
    answer.decimal_point += int32_t(answer.num_digits);
    answer.num_digits -= uint32_t(trailing_zeros);
  }
  if(answer.num_digits > max_digits ) {
    answer.num_digits = max_digits;
    answer.truncated = true;
  }
  if (('e' == *p) || ('E' == *p)) {
    ++p;
    bool neg_exp = false;
    if ('-' == *p) {
      neg_exp = true;
      ++p;
    } else if ('+' == *p) {
      ++p;
    }
    int32_t exp_number = 0; // exponential part
    while (is_integer(*p)) {
      uint8_t digit = uint8_t(*p - '0');
      if (exp_number < 0x10000) {
        exp_number = 10 * exp_number + digit;
      }
      ++p;
    }
    answer.decimal_point += (neg_exp ? -exp_number : exp_number);
  }
  return answer;
}